

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

void __thiscall booster::log::sinks::syslog::syslog(syslog *this,int __pri,char *__fmt,...)

{
  data *pdVar1;
  char *__ident;
  int in_ECX;
  data *in_stack_ffffffffffffffa0;
  
  sink::sink((sink *)in_stack_ffffffffffffffa0);
  (this->super_sink)._vptr_sink = (_func_int **)&PTR_log_002e8cd8;
  pdVar1 = (data *)operator_new(0x28);
  data::data(in_stack_ffffffffffffffa0);
  hold_ptr<booster::log::sinks::syslog::data>::hold_ptr(&this->d,pdVar1);
  pdVar1 = hold_ptr<booster::log::sinks::syslog::data>::operator->(&this->d);
  std::__cxx11::string::operator=((string *)pdVar1,___pri);
  pdVar1 = hold_ptr<booster::log::sinks::syslog::data>::operator->(&this->d);
  pdVar1->log_was_opened = true;
  hold_ptr<booster::log::sinks::syslog::data>::operator->(&this->d);
  __ident = (char *)std::__cxx11::string::c_str();
  openlog(__ident,(int)__fmt,in_ECX);
  return;
}

Assistant:

syslog::syslog(std::string const &id,int opts,int facility) : 
			d(new data())
		{
			d->id = id;
			d->log_was_opened = true;
			openlog(d->id.c_str(),opts,facility);
		}